

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcSystemFurnitureElementType::~IfcSystemFurnitureElementType
          (IfcSystemFurnitureElementType *this)

{
  IfcElementType::~IfcElementType((IfcElementType *)this,&PTR_construction_vtable_24__007a7300);
  return;
}

Assistant:

IfcSystemFurnitureElementType() : Object("IfcSystemFurnitureElementType") {}